

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPrivateKey.cpp
# Opt level: O2

ByteString * __thiscall
RSAPrivateKey::serialise(ByteString *__return_storage_ptr__,RSAPrivateKey *this)

{
  ByteString local_240;
  ByteString local_218;
  ByteString local_1f0;
  ByteString local_1c8;
  ByteString local_1a0;
  ByteString local_178;
  ByteString local_150;
  ByteString local_128;
  ByteString local_100;
  ByteString local_d8;
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_128,&this->p);
  ByteString::serialise(&local_150,&this->q);
  operator+(&local_100,&local_128,&local_150);
  ByteString::serialise(&local_178,&this->pq);
  operator+(&local_d8,&local_100,&local_178);
  ByteString::serialise(&local_1a0,&this->dp1);
  operator+(&local_b0,&local_d8,&local_1a0);
  ByteString::serialise(&local_1c8,&this->dq1);
  operator+(&local_88,&local_b0,&local_1c8);
  ByteString::serialise(&local_1f0,&this->d);
  operator+(&local_60,&local_88,&local_1f0);
  ByteString::serialise(&local_218,&this->n);
  operator+(&local_38,&local_60,&local_218);
  ByteString::serialise(&local_240,&this->e);
  operator+(__return_storage_ptr__,&local_38,&local_240);
  ByteString::~ByteString(&local_240);
  ByteString::~ByteString(&local_38);
  ByteString::~ByteString(&local_218);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_1f0);
  ByteString::~ByteString(&local_88);
  ByteString::~ByteString(&local_1c8);
  ByteString::~ByteString(&local_b0);
  ByteString::~ByteString(&local_1a0);
  ByteString::~ByteString(&local_d8);
  ByteString::~ByteString(&local_178);
  ByteString::~ByteString(&local_100);
  ByteString::~ByteString(&local_150);
  ByteString::~ByteString(&local_128);
  return __return_storage_ptr__;
}

Assistant:

ByteString RSAPrivateKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       pq.serialise() +
	       dp1.serialise() +
	       dq1.serialise() +
	       d.serialise() +
	       n.serialise() +
	       e.serialise();
}